

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

bool FindMeshNode(Ref<glTF::Node> *nodeIn,Ref<glTF::Node> *meshNode,string *meshID)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  pointer pRVar4;
  Node *pNVar5;
  uint uVar6;
  ulong uVar7;
  string local_50;
  
  pNVar5 = (nodeIn->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl
           .super__Vector_impl_data._M_start[nodeIn->index];
  if (*(pointer *)
       ((long)&(pNVar5->meshes).
               super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_> +
       8) != *(pointer *)
              &(pNVar5->meshes).
               super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>.
               _M_impl) {
    uVar7 = 1;
    do {
      iVar3 = std::__cxx11::string::compare((string *)meshID);
      if (iVar3 == 0) {
        meshNode->index = nodeIn->index;
        meshNode->vector = nodeIn->vector;
        return true;
      }
      pNVar5 = (nodeIn->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>).
               _M_impl.super__Vector_impl_data._M_start[nodeIn->index];
      bVar2 = uVar7 < (ulong)((long)*(pointer *)
                                     ((long)&(pNVar5->meshes).
                                             super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                                     + 8) -
                              *(long *)&(pNVar5->meshes).
                                        super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                                        ._M_impl >> 4);
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  pRVar4 = *(pointer *)
            &(pNVar5->children).
             super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
             _M_impl;
  if (*(pointer *)
       ((long)&(pNVar5->children).
               super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_> +
       8) == pRVar4) {
    bVar2 = false;
  }
  else {
    uVar6 = 1;
    uVar7 = 0;
    do {
      pcVar1 = (meshID->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + meshID->_M_string_length);
      bVar2 = FindMeshNode(pRVar4 + uVar7,meshNode,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar2) {
        return bVar2;
      }
      uVar7 = (ulong)uVar6;
      pNVar5 = (nodeIn->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>).
               _M_impl.super__Vector_impl_data._M_start[nodeIn->index];
      pRVar4 = *(pointer *)
                &(pNVar5->children).
                 super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
                 _M_impl;
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)((long)*(pointer *)
                                    ((long)&(pNVar5->children).
                                            super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                                    + 8) - (long)pRVar4 >> 4));
  }
  return bVar2;
}

Assistant:

bool FindMeshNode(Ref<Node>& nodeIn, Ref<Node>& meshNode, std::string meshID)
{
    for (unsigned int i = 0; i < nodeIn->meshes.size(); ++i) {
        if (meshID.compare(nodeIn->meshes[i]->id) == 0) {
          meshNode = nodeIn;
          return true;
        }
    }

    for (unsigned int i = 0; i < nodeIn->children.size(); ++i) {
        if(FindMeshNode(nodeIn->children[i], meshNode, meshID)) {
          return true;
        }
    }

    return false;
}